

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase1885::~TestCase1885(TestCase1885 *this)

{
  TestCase1885 *this_local;
  
  kj::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

TEST(Encoding, GenericDefaults) {
  test::TestUseGenerics::Reader reader;

  EXPECT_EQ(123, reader.getDefault().getFoo().getInt16Field());
  EXPECT_EQ(123, reader.getDefaultInner().getFoo().getInt16Field());
  EXPECT_EQ("text", reader.getDefaultInner().getBar());
  EXPECT_EQ(123, reader.getDefaultUser().getBasic().getFoo().getInt16Field());
  EXPECT_EQ("text", reader.getDefaultWrapper().getValue().getFoo());
  EXPECT_EQ(321, reader.getDefaultWrapper().getValue().getRev().getFoo().getInt16Field());
  EXPECT_EQ("text", reader.getDefaultWrapper2().getValue().getValue().getFoo());
  EXPECT_EQ(321, reader.getDefaultWrapper2().getValue()
      .getValue().getRev().getFoo().getInt16Field());
}